

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

void __thiscall hanabi_learning_env::HanabiState::ApplyRandomChance(HanabiState *this)

{
  HanabiMove move;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  chance_outcomes;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  local_40;
  
  ChanceOutcomes(&local_40,this);
  if (local_40.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    move = HanabiGame::PickRandomChance(this->parent_game_,&local_40);
    ApplyMove(this,move);
    std::
    pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
    ::~pair(&local_40);
    return;
  }
  __assert_fail("!chance_outcomes.second.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_state.cc"
                ,0x11c,"void hanabi_learning_env::HanabiState::ApplyRandomChance()");
}

Assistant:

void HanabiState::ApplyRandomChance() {
  auto chance_outcomes = ChanceOutcomes();
  REQUIRE(!chance_outcomes.second.empty());
  ApplyMove(ParentGame()->PickRandomChance(chance_outcomes));
}